

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_server_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  uint8_t uVar1;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  ptls_iovec_t message_02;
  ptls_iovec_t message_03;
  ptls_iovec_t message_04;
  ptls_iovec_t message_05;
  int iVar2;
  size_t in_RCX;
  ptls_t *tls_00;
  uint8_t *in_RDX;
  ptls_message_emitter_t *in_RSI;
  ptls_t *in_RDI;
  int in_R8D;
  ptls_handshake_properties_t *in_R9;
  int ret;
  uint8_t type;
  ptls_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffcc;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  
  uVar1 = *in_RDX;
  uVar3 = CONCAT13(uVar1,in_stack_ffffffffffffffcc);
  tls_00 = (ptls_t *)(ulong)(in_RDI->state - PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO);
  switch(tls_00) {
  case (ptls_t *)0x0:
  case (ptls_t *)0x1:
    if ((uVar1 == '\x01') && (in_R8D != 0)) {
      message_05.len = in_RCX;
      message_05.base = in_RDX;
      iVar2 = server_handle_hello(in_RDI,in_RSI,message_05,in_R9);
    }
    else {
      iVar2 = 0x28;
    }
    break;
  case (ptls_t *)0x2:
    if (uVar1 == '\v') {
      message_00.len._0_4_ = in_stack_ffffffffffffffc8;
      message_00.base = (uint8_t *)tls_00;
      message_00.len._4_4_ = uVar3;
      iVar2 = server_handle_certificate(in_stack_ffffffffffffffb8,message_00);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x3:
    if (uVar1 == '\x0f') {
      message_02.base._4_4_ = uVar3;
      message_02.base._0_4_ = in_stack_ffffffffffffffc8;
      message_02.len = (size_t)in_R9;
      iVar2 = server_handle_certificate_verify(tls_00,message_02);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x4:
    if (((byte)in_RDI->ctx->field_0x70 >> 4 & 1) != 0) {
      __assert_fail("!tls->ctx->omit_end_of_early_data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                    ,0x1203,
                    "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                   );
    }
    if (uVar1 == '\x05') {
      message_03.base._4_4_ = uVar3;
      message_03.base._0_4_ = in_stack_ffffffffffffffc8;
      message_03.len = (size_t)in_R9;
      iVar2 = server_handle_end_of_early_data(tls_00,message_03);
    }
    else {
      iVar2 = 10;
    }
    break;
  case (ptls_t *)0x5:
    if ((uVar1 == '\x14') && (in_R8D != 0)) {
      message_01.len._0_4_ = in_stack_ffffffffffffffc8;
      message_01.base = (uint8_t *)tls_00;
      message_01.len._4_4_ = uVar3;
      iVar2 = server_handle_finished(in_stack_ffffffffffffffb8,message_01);
    }
    else {
      iVar2 = 0x28;
    }
    break;
  default:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                  ,0x121c,
                  "int handle_server_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  case (ptls_t *)0x7:
    if (uVar1 == '\x18') {
      message_04.len = (size_t)in_RDI;
      message_04.base = (uint8_t *)in_RSI;
      iVar2 = handle_key_update((ptls_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),
                                (ptls_message_emitter_t *)in_R9,message_04);
    }
    else {
      iVar2 = 10;
    }
  }
  return iVar2;
}

Assistant:

static int handle_server_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO:
    case PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_CLIENT_HELLO && is_end_of_record) {
            ret = server_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE) {
            ret = server_handle_certificate(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = server_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA:
        assert(!tls->ctx->omit_end_of_early_data);
        if (type == PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA) {
            ret = server_handle_end_of_early_data(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_SERVER_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = server_handle_finished(tls, message);
        } else {
            ret = PTLS_ALERT_HANDSHAKE_FAILURE;
        }
        break;
    case PTLS_STATE_SERVER_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}